

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::StreamArchive::find_entry(StreamArchive *this,ResourceTag tag,Hash hash,Entry *entry)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  
  if (this->imported_metadata != (ExportedMetadataHeader *)0x0) {
    bVar3 = find_entry_from_metadata(this->imported_metadata,tag,hash,entry);
    return bVar3;
  }
  uVar1 = this->seen_blobs[tag]._M_h._M_bucket_count;
  uVar5 = hash % uVar1;
  p_Var6 = this->seen_blobs[tag]._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var6->_M_nxt, p_Var7 = p_Var6, p_Var6->_M_nxt[1]._M_nxt != (_Hash_node_base *)hash)
     ) {
    while (p_Var6 = p_Var4, p_Var4 = p_Var6->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, p_Var4[1]._M_nxt == (_Hash_node_base *)hash)) goto LAB_00143b4d;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00143b4d:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var7->_M_nxt;
  }
  if (p_Var4 != (_Hash_node_base *)0x0) {
    *(_Hash_node_base **)&(entry->header).crc = p_Var4[4]._M_nxt;
    p_Var2 = p_Var4[3]._M_nxt;
    entry->offset = (uint64_t)p_Var4[2]._M_nxt;
    *(_Hash_node_base **)&entry->header = p_Var2;
  }
  return p_Var4 != (_Hash_node_base *)0x0;
}

Assistant:

bool find_entry(ResourceTag tag, Hash hash, Entry &entry) const
	{
		if (imported_metadata)
		{
			return find_entry_from_metadata(imported_metadata, tag, hash, &entry);
		}
		else
		{
			auto itr = seen_blobs[tag].find(hash);
			if (itr == end(seen_blobs[tag]))
				return false;

			entry = itr->second;
			return true;
		}
	}